

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_dotset_value(JSON_Object *object,char *name,JSON_Value *value)

{
  JSON_Value_Type JVar1;
  JSON_Status JVar2;
  char *pcVar3;
  JSON_Value *pJVar4;
  JSON_Object *pJVar5;
  char *name_00;
  char *name_copy;
  size_t name_len;
  JSON_Status status;
  JSON_Object *new_object;
  JSON_Object *temp_object;
  JSON_Value *new_value;
  JSON_Value *temp_value;
  char *dot_pos;
  JSON_Value *value_local;
  char *name_local;
  JSON_Object *object_local;
  
  if (((object == (JSON_Object *)0x0) || (name == (char *)0x0)) || (value == (JSON_Value *)0x0)) {
    object_local._4_4_ = -1;
  }
  else {
    pcVar3 = strchr(name,0x2e);
    if (pcVar3 == (char *)0x0) {
      object_local._4_4_ = json_object_set_value(object,name,value);
    }
    else {
      pJVar4 = json_object_getn_value(object,name,(long)pcVar3 - (long)name);
      if (pJVar4 == (JSON_Value *)0x0) {
        pJVar4 = json_value_init_object();
        if (pJVar4 == (JSON_Value *)0x0) {
          object_local._4_4_ = -1;
        }
        else {
          pJVar5 = json_value_get_object(pJVar4);
          JVar2 = json_object_dotset_value(pJVar5,pcVar3 + 1,value);
          if (JVar2 == 0) {
            name_00 = parson_strndup(name,(long)pcVar3 - (long)name);
            if (name_00 == (char *)0x0) {
              json_object_dotremove_internal(pJVar5,pcVar3 + 1,0);
              json_value_free(pJVar4);
              object_local._4_4_ = -1;
            }
            else {
              JVar2 = json_object_add(object,name_00,pJVar4);
              if (JVar2 == 0) {
                object_local._4_4_ = 0;
              }
              else {
                (*parson_free)(name_00);
                json_object_dotremove_internal(pJVar5,pcVar3 + 1,0);
                json_value_free(pJVar4);
                object_local._4_4_ = -1;
              }
            }
          }
          else {
            json_value_free(pJVar4);
            object_local._4_4_ = -1;
          }
        }
      }
      else {
        JVar1 = json_value_get_type(pJVar4);
        if (JVar1 == 4) {
          pJVar5 = json_value_get_object(pJVar4);
          object_local._4_4_ = json_object_dotset_value(pJVar5,pcVar3 + 1,value);
        }
        else {
          object_local._4_4_ = -1;
        }
      }
    }
  }
  return object_local._4_4_;
}

Assistant:

JSON_Status json_object_dotset_value(JSON_Object *object, const char *name, JSON_Value *value) {
    const char *dot_pos = NULL;
    JSON_Value *temp_value = NULL, *new_value = NULL;
    JSON_Object *temp_object = NULL, *new_object = NULL;
    JSON_Status status = JSONFailure;
    size_t name_len = 0;
    char *name_copy = NULL;
    
    if (object == NULL || name == NULL || value == NULL) {
        return JSONFailure;
    }
    dot_pos = strchr(name, '.');
    if (dot_pos == NULL) {
        return json_object_set_value(object, name, value);
    }
    name_len = dot_pos - name;
    temp_value = json_object_getn_value(object, name, name_len);
    if (temp_value) {
        /* Don't overwrite existing non-object (unlike json_object_set_value, but it shouldn't be changed at this point) */
        if (json_value_get_type(temp_value) != JSONObject) {
            return JSONFailure;
        }
        temp_object = json_value_get_object(temp_value);
        return json_object_dotset_value(temp_object, dot_pos + 1, value);
    }
    new_value = json_value_init_object();
    if (new_value == NULL) {
        return JSONFailure;
    }
    new_object = json_value_get_object(new_value);
    status = json_object_dotset_value(new_object, dot_pos + 1, value);
    if (status != JSONSuccess) {
        json_value_free(new_value);
        return JSONFailure;
    }
    name_copy = parson_strndup(name, name_len);
    if (!name_copy) {
        json_object_dotremove_internal(new_object, dot_pos + 1, 0);
        json_value_free(new_value);
        return JSONFailure;
    }
    status = json_object_add(object, name_copy, new_value);
    if (status != JSONSuccess) {
        parson_free(name_copy);
        json_object_dotremove_internal(new_object, dot_pos + 1, 0);
        json_value_free(new_value);
        return JSONFailure;
    }
    return JSONSuccess;
}